

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O0

boolean decode_mcu_slow(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  long lVar1;
  long lVar2;
  boolean bVar3;
  int iVar4;
  byte bVar5;
  sbyte sVar6;
  long in_RSI;
  long in_RDI;
  int look_2;
  int nb_2;
  int look_1;
  int nb_1;
  int ci;
  int look;
  int nb;
  int r;
  int k;
  int s;
  d_derived_tbl *actbl;
  d_derived_tbl *dctbl;
  JBLOCKROW block;
  savable_state_conflict state;
  int blkn;
  bitread_working_state br_state;
  int bits_left;
  bit_buf_type get_buffer;
  huff_entropy_ptr_conflict entropy;
  int in_stack_ffffffffffffff3c;
  uint in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  undefined2 *puVar7;
  undefined2 *puVar8;
  uint in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  uint in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  int local_90;
  uint local_8c;
  undefined8 local_6c;
  undefined8 local_64;
  int local_5c;
  undefined8 local_58;
  undefined8 local_50;
  ulong local_48;
  int local_40;
  int local_2c;
  ulong local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_20 = *(long *)(in_RDI + 0x250);
  local_58 = **(undefined8 **)(in_RDI + 0x28);
  local_50 = *(undefined8 *)(*(long *)(in_RDI + 0x28) + 8);
  local_28 = *(ulong *)(local_20 + 0x18);
  local_2c = *(int *)(local_20 + 0x20);
  local_6c = *(undefined8 *)(local_20 + 0x28);
  local_64 = *(undefined8 *)(local_20 + 0x30);
  local_5c = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  do {
    if (*(int *)(local_10 + 0x1e0) <= local_5c) {
      **(undefined8 **)(local_10 + 0x28) = local_58;
      *(undefined8 *)(*(long *)(local_10 + 0x28) + 8) = local_50;
      *(ulong *)(local_20 + 0x18) = local_28;
      *(int *)(local_20 + 0x20) = local_2c;
      *(undefined8 *)(local_20 + 0x28) = local_6c;
      *(undefined8 *)(local_20 + 0x30) = local_64;
      return 1;
    }
    if (local_18 == 0) {
      puVar7 = (undefined2 *)0x0;
    }
    else {
      puVar7 = *(undefined2 **)(local_18 + (long)local_5c * 8);
    }
    lVar1 = *(long *)(local_20 + 0x80 + (long)local_5c * 8);
    lVar2 = *(long *)(local_20 + 0xd0 + (long)local_5c * 8);
    puVar8 = puVar7;
    if (local_2c < 8) {
      bVar3 = jpeg_fill_bit_buffer
                        ((bitread_working_state *)
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
      if (bVar3 == 0) {
        return 0;
      }
      local_28 = local_48;
      local_2c = local_40;
      if (7 < local_40) goto LAB_0014caaf;
      in_stack_ffffffffffffff68 = 1;
LAB_0014cb1e:
      local_8c = jpeg_huff_decode((bitread_working_state *)
                                  CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                                  CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                  (int)((ulong)puVar8 >> 0x20),
                                  (d_derived_tbl *)
                                  CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                  in_stack_ffffffffffffff3c);
      if ((int)local_8c < 0) {
        return 0;
      }
      local_28 = local_48;
      local_2c = local_40;
    }
    else {
LAB_0014caaf:
      in_stack_ffffffffffffff64 = (uint)(local_28 >> ((char)local_2c - 8U & 0x3f)) & 0xff;
      in_stack_ffffffffffffff68 =
           *(int *)(lVar1 + 0x128 + (long)(int)in_stack_ffffffffffffff64 * 4) >> 8;
      if (8 < in_stack_ffffffffffffff68) goto LAB_0014cb1e;
      local_2c = local_2c - in_stack_ffffffffffffff68;
      local_8c = *(uint *)(lVar1 + 0x128 + (long)(int)in_stack_ffffffffffffff64 * 4) & 0xff;
    }
    if (local_8c != 0) {
      if (local_2c < (int)local_8c) {
        bVar3 = jpeg_fill_bit_buffer
                          ((bitread_working_state *)
                           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                           CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
        if (bVar3 == 0) {
          return 0;
        }
        local_28 = local_48;
        local_2c = local_40;
      }
      local_2c = local_2c - local_8c;
      bVar5 = (byte)local_8c;
      in_stack_ffffffffffffff40 =
           (uint)(local_28 >> ((byte)local_2c & 0x3f)) & (1 << (bVar5 & 0x1f)) - 1U;
      in_stack_ffffffffffffff44 =
           (int)(in_stack_ffffffffffffff40 - (1 << (bVar5 - 1 & 0x1f))) >> 0x1f;
      local_8c = in_stack_ffffffffffffff40 +
                 (in_stack_ffffffffffffff44 & (-1 << (bVar5 & 0x1f)) + 1U);
      in_stack_ffffffffffffff6c = in_stack_ffffffffffffff40;
    }
    if (*(int *)(local_20 + 0x120 + (long)local_5c * 4) != 0) {
      in_stack_ffffffffffffff60 = *(int *)(local_10 + 0x1e4 + (long)local_5c * 4);
      iVar4 = *(int *)((long)&local_6c + (long)in_stack_ffffffffffffff60 * 4) + local_8c;
      *(int *)((long)&local_6c + (long)in_stack_ffffffffffffff60 * 4) = iVar4;
      if (puVar7 != (undefined2 *)0x0) {
        *puVar7 = (short)iVar4;
      }
    }
    if ((*(int *)(local_20 + 0x148 + (long)local_5c * 4) == 0) || (puVar7 == (undefined2 *)0x0)) {
      for (local_90 = 1; local_90 < 0x40; local_90 = local_90 + 1) {
        if (local_2c < 8) {
          bVar3 = jpeg_fill_bit_buffer
                            ((bitread_working_state *)
                             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                             in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
          if (bVar3 == 0) {
            return 0;
          }
          local_28 = local_48;
          local_2c = local_40;
          if (7 < local_40) goto LAB_0014cffd;
          in_stack_ffffffffffffff54 = 1;
LAB_0014d06c:
          local_8c = jpeg_huff_decode((bitread_working_state *)
                                      CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                      (int)((ulong)puVar8 >> 0x20),
                                      (d_derived_tbl *)
                                      CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                      in_stack_ffffffffffffff3c);
          if ((int)local_8c < 0) {
            return 0;
          }
          local_28 = local_48;
          local_2c = local_40;
        }
        else {
LAB_0014cffd:
          in_stack_ffffffffffffff50 = (uint)(local_28 >> ((char)local_2c - 8U & 0x3f)) & 0xff;
          in_stack_ffffffffffffff54 =
               *(int *)(lVar2 + 0x128 + (long)(int)in_stack_ffffffffffffff50 * 4) >> 8;
          if (8 < in_stack_ffffffffffffff54) goto LAB_0014d06c;
          local_2c = local_2c - in_stack_ffffffffffffff54;
          local_8c = *(uint *)(lVar2 + 0x128 + (long)(int)in_stack_ffffffffffffff50 * 4) & 0xff;
        }
        in_stack_ffffffffffffff6c = (int)local_8c >> 4;
        local_8c = local_8c & 0xf;
        if (local_8c == 0) {
          if (in_stack_ffffffffffffff6c != 0xf) break;
          local_90 = local_90 + 0xf;
        }
        else {
          local_90 = in_stack_ffffffffffffff6c + local_90;
          if (local_2c < (int)local_8c) {
            bVar3 = jpeg_fill_bit_buffer
                              ((bitread_working_state *)
                               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                               in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
            if (bVar3 == 0) {
              return 0;
            }
            local_28 = local_48;
            local_2c = local_40;
          }
          local_2c = local_2c - local_8c;
        }
      }
    }
    else {
      for (local_90 = 1; local_90 < 0x40; local_90 = local_90 + 1) {
        if (local_2c < 8) {
          bVar3 = jpeg_fill_bit_buffer
                            ((bitread_working_state *)
                             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                             in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
          if (bVar3 == 0) {
            return 0;
          }
          local_28 = local_48;
          local_2c = local_40;
          if (7 < local_40) goto LAB_0014cd66;
          in_stack_ffffffffffffff5c = 1;
LAB_0014cdd5:
          local_8c = jpeg_huff_decode((bitread_working_state *)
                                      CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                      (int)((ulong)puVar8 >> 0x20),
                                      (d_derived_tbl *)
                                      CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                      in_stack_ffffffffffffff3c);
          if ((int)local_8c < 0) {
            return 0;
          }
          local_28 = local_48;
          local_2c = local_40;
        }
        else {
LAB_0014cd66:
          in_stack_ffffffffffffff58 = (uint)(local_28 >> ((char)local_2c - 8U & 0x3f)) & 0xff;
          in_stack_ffffffffffffff5c =
               *(int *)(lVar2 + 0x128 + (long)(int)in_stack_ffffffffffffff58 * 4) >> 8;
          if (8 < in_stack_ffffffffffffff5c) goto LAB_0014cdd5;
          local_2c = local_2c - in_stack_ffffffffffffff5c;
          local_8c = *(uint *)(lVar2 + 0x128 + (long)(int)in_stack_ffffffffffffff58 * 4) & 0xff;
        }
        in_stack_ffffffffffffff6c = (int)local_8c >> 4;
        local_8c = local_8c & 0xf;
        if (local_8c == 0) {
          if (in_stack_ffffffffffffff6c != 0xf) break;
          local_90 = local_90 + 0xf;
        }
        else {
          local_90 = in_stack_ffffffffffffff6c + local_90;
          if (local_2c < (int)local_8c) {
            bVar3 = jpeg_fill_bit_buffer
                              ((bitread_working_state *)
                               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                               in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
            if (bVar3 == 0) {
              return 0;
            }
            local_28 = local_48;
            local_2c = local_40;
          }
          local_2c = local_2c - local_8c;
          sVar6 = (sbyte)local_8c;
          in_stack_ffffffffffffff6c =
               (uint)(local_28 >> ((byte)local_2c & 0x3f)) & (1 << sVar6) - 1U;
          iVar4 = in_stack_ffffffffffffff6c - (1 << (sVar6 - 1U & 0x1f));
          in_stack_ffffffffffffff3c = iVar4 >> 0x1f;
          puVar7[jpeg_natural_order[local_90]] =
               (short)in_stack_ffffffffffffff6c +
               ((ushort)(iVar4 >> 0x1f) & (short)(-1 << sVar6) + 1U);
        }
      }
    }
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

LOCAL(boolean)
decode_mcu_slow(j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr)cinfo->entropy;
  BITREAD_STATE_VARS;
  int blkn;
  savable_state state;
  /* Outer loop handles each block in the MCU */

  /* Load up working state */
  BITREAD_LOAD_STATE(cinfo, entropy->bitstate);
  state = entropy->saved;

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    JBLOCKROW block = MCU_data ? MCU_data[blkn] : NULL;
    d_derived_tbl *dctbl = entropy->dc_cur_tbls[blkn];
    d_derived_tbl *actbl = entropy->ac_cur_tbls[blkn];
    register int s, k, r;

    /* Decode a single block's worth of coefficients */

    /* Section F.2.2.1: decode the DC coefficient difference */
    HUFF_DECODE(s, br_state, dctbl, return FALSE, label1);
    if (s) {
      CHECK_BIT_BUFFER(br_state, s, return FALSE);
      r = GET_BITS(s);
      s = HUFF_EXTEND(r, s);
    }

    if (entropy->dc_needed[blkn]) {
      /* Convert DC difference to actual value, update last_dc_val */
      int ci = cinfo->MCU_membership[blkn];
      /* Certain malformed JPEG images produce repeated DC coefficient
       * differences of 2047 or -2047, which causes state.last_dc_val[ci] to
       * grow until it overflows or underflows a 32-bit signed integer.  This
       * behavior is, to the best of our understanding, innocuous, and it is
       * unclear how to work around it without potentially affecting
       * performance.  Thus, we (hopefully temporarily) suppress UBSan integer
       * overflow errors for this function and decode_mcu_fast().
       */
      s += state.last_dc_val[ci];
      state.last_dc_val[ci] = s;
      if (block) {
        /* Output the DC coefficient (assumes jpeg_natural_order[0] = 0) */
        (*block)[0] = (JCOEF)s;
      }
    }

    if (entropy->ac_needed[blkn] && block) {

      /* Section F.2.2.2: decode the AC coefficients */
      /* Since zeroes are skipped, output area must be cleared beforehand */
      for (k = 1; k < DCTSIZE2; k++) {
        HUFF_DECODE(s, br_state, actbl, return FALSE, label2);

        r = s >> 4;
        s &= 15;

        if (s) {
          k += r;
          CHECK_BIT_BUFFER(br_state, s, return FALSE);
          r = GET_BITS(s);
          s = HUFF_EXTEND(r, s);
          /* Output coefficient in natural (dezigzagged) order.
           * Note: the extra entries in jpeg_natural_order[] will save us
           * if k >= DCTSIZE2, which could happen if the data is corrupted.
           */
          (*block)[jpeg_natural_order[k]] = (JCOEF)s;
        } else {
          if (r != 15)
            break;
          k += 15;
        }
      }

    } else {

      /* Section F.2.2.2: decode the AC coefficients */
      /* In this path we just discard the values */
      for (k = 1; k < DCTSIZE2; k++) {
        HUFF_DECODE(s, br_state, actbl, return FALSE, label3);

        r = s >> 4;
        s &= 15;

        if (s) {
          k += r;
          CHECK_BIT_BUFFER(br_state, s, return FALSE);
          DROP_BITS(s);
        } else {
          if (r != 15)
            break;
          k += 15;
        }
      }
    }
  }

  /* Completed MCU, so update state */
  BITREAD_SAVE_STATE(cinfo, entropy->bitstate);
  entropy->saved = state;
  return TRUE;
}